

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O1

void modified_signaturecase::test_method<picnic_params_t_const&>(anon_enum_32 *parameters)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  context_frame context_frame_1580;
  modified_signaturecase t;
  context_frame local_2fc;
  undefined ****local_2f8;
  undefined1 local_2f0;
  undefined ***local_2e8;
  anon_enum_32 **local_2e0;
  const_string local_2d8;
  const_string local_2c8;
  const_string local_2b8;
  const_string local_2a8;
  const_string local_298;
  undefined1 local_288 [16];
  undefined8 ***pppuStack_278;
  char *pcStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  ulong *puStack_110;
  long lStack_108;
  ulong auStack_100 [3];
  anon_enum_32 *local_e8;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  undefined **local_90;
  undefined1 local_88;
  undefined ***local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined ***local_40;
  char *local_38;
  
  local_40 = &local_70;
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00186720;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_80 = &local_50;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_001869a8;
  local_38 = "parameters";
  local_2e8 = &local_90;
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_00186968;
  local_78 = " = ";
  local_2e0 = &local_e8;
  pppuStack_278 = &local_2f8;
  local_2f0 = 0;
  local_2f8 = (undefined ****)&PTR__lazy_ostream_00186928;
  local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
  local_288._0_8_ = &PTR__lazy_ostream_001868e8;
  pcStack_270 = "; ";
  local_e8 = parameters;
  boost::test_tools::tt_detail::context_frame::context_frame(&local_2fc,(lazy_ostream *)local_288);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_2fc);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  if (bVar2) {
    local_298.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_298.m_end = "";
    lStack_108 = 0;
    auStack_100[0] = 0;
    auStack_100[1] = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    local_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    puStack_110 = (ulong *)0x0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    local_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    uStack_218 = 0;
    uStack_210 = 0;
    local_288._0_8_ = (_func_int **)0x0;
    local_288._8_8_ = 0;
    pppuStack_278 = (undefined8 ***)0x0;
    pcStack_270 = (char *)0x0;
    uStack_268 = 0;
    uStack_260 = 0;
    uStack_258 = 0;
    uStack_250 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    lStack_108 = 0;
    auStack_100[0] = auStack_100[0] & 0xffffffffffffff00;
    local_2f8 = (undefined ****)CONCAT71(local_2f8._1_7_,0x22);
    puStack_110 = auStack_100;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,(char *)&local_2f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,"modified_signature",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"\" fixture ctor",0xe);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&puStack_110,(string *)&local_2f8);
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    local_a0.m_begin = (iterator)puStack_110;
    local_a0.m_end = (iterator)((long)puStack_110 + lStack_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_298,0x9e,&local_a0);
    if (puStack_110 != auStack_100) {
      operator_delete(puStack_110);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    std::ios_base::~ios_base((ios_base *)&uStack_218);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2a8.m_end = "";
    lStack_108 = 0;
    auStack_100[0] = 0;
    auStack_100[1] = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    local_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    puStack_110 = (ulong *)0x0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    local_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    uStack_218 = 0;
    uStack_210 = 0;
    local_288._0_8_ = (_func_int **)0x0;
    local_288._8_8_ = 0;
    pppuStack_278 = (undefined8 ***)0x0;
    pcStack_270 = (char *)0x0;
    uStack_268 = 0;
    uStack_260 = 0;
    uStack_258 = 0;
    uStack_250 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    lStack_108 = 0;
    auStack_100[0] = auStack_100[0] & 0xffffffffffffff00;
    local_2f8 = (undefined ****)CONCAT71(local_2f8._1_7_,0x22);
    puStack_110 = auStack_100;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,(char *)&local_2f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,"modified_signature",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"\" fixture setup",0xf);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&puStack_110,(string *)&local_2f8);
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    local_b0.m_begin = (iterator)puStack_110;
    local_b0.m_end = (iterator)((long)puStack_110 + lStack_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2a8,0x9e,&local_b0);
    if (puStack_110 != auStack_100) {
      operator_delete(puStack_110);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    std::ios_base::~ios_base((ios_base *)&uStack_218);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2b8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2b8.m_end = "";
    lStack_108 = 0;
    auStack_100[0] = 0;
    auStack_100[1] = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    local_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    puStack_110 = (ulong *)0x0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    local_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    uStack_218 = 0;
    uStack_210 = 0;
    local_288._0_8_ = (_func_int **)0x0;
    local_288._8_8_ = 0;
    pppuStack_278 = (undefined8 ***)0x0;
    pcStack_270 = (char *)0x0;
    uStack_268 = 0;
    uStack_260 = 0;
    uStack_258 = 0;
    uStack_250 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    lStack_108 = 0;
    auStack_100[0] = auStack_100[0] & 0xffffffffffffff00;
    local_2f8 = (undefined ****)CONCAT71(local_2f8._1_7_,0x22);
    puStack_110 = auStack_100;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,(char *)&local_2f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,"modified_signature",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"\" test entry",0xc);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&puStack_110,(string *)&local_2f8);
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    local_c0.m_begin = (iterator)puStack_110;
    local_c0.m_end = (iterator)((long)puStack_110 + lStack_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2b8,0x9e,&local_c0);
    if (puStack_110 != auStack_100) {
      operator_delete(puStack_110);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    std::ios_base::~ios_base((ios_base *)&uStack_218);
    _impl<picnic_params_t>((modified_signaturecase *)&local_90,parameters);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2c8.m_end = "";
    lStack_108 = 0;
    auStack_100[0] = 0;
    auStack_100[1] = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    local_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    puStack_110 = (ulong *)0x0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    local_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    uStack_218 = 0;
    uStack_210 = 0;
    local_288._0_8_ = (_func_int **)0x0;
    local_288._8_8_ = 0;
    pppuStack_278 = (undefined8 ***)0x0;
    pcStack_270 = (char *)0x0;
    uStack_268 = 0;
    uStack_260 = 0;
    uStack_258 = 0;
    uStack_250 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    lStack_108 = 0;
    auStack_100[0] = auStack_100[0] & 0xffffffffffffff00;
    local_2f8 = (undefined ****)CONCAT71(local_2f8._1_7_,0x22);
    puStack_110 = auStack_100;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,(char *)&local_2f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,"modified_signature",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,"\" fixture teardown",0x12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&puStack_110,(string *)&local_2f8);
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    local_d0.m_begin = (iterator)puStack_110;
    local_d0.m_end = (iterator)((long)puStack_110 + lStack_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2c8,0x9e,&local_d0);
    if (puStack_110 != auStack_100) {
      operator_delete(puStack_110);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    std::ios_base::~ios_base((ios_base *)&uStack_218);
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    local_2d8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_2d8.m_end = "";
    lStack_108 = 0;
    auStack_100[0] = 0;
    auStack_100[1] = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    local_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    puStack_110 = (ulong *)0x0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    local_208 = 0;
    uStack_200 = 0;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    uStack_220 = 0;
    uStack_218 = 0;
    uStack_210 = 0;
    local_288._0_8_ = (_func_int **)0x0;
    local_288._8_8_ = 0;
    pppuStack_278 = (undefined *****)0x0;
    pcStack_270 = (char *)0x0;
    uStack_268 = 0;
    uStack_260 = 0;
    uStack_258 = 0;
    uStack_250 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    lStack_108 = 0;
    auStack_100[0] = auStack_100[0] & 0xffffffffffffff00;
    local_2f8 = (undefined ****)CONCAT71(local_2f8._1_7_,0x22);
    puStack_110 = auStack_100;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,(char *)&local_2f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,"modified_signature",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"\" fixture dtor",0xe);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&puStack_110,(string *)&local_2f8);
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    local_e0.m_begin = (iterator)puStack_110;
    local_e0.m_end = (iterator)((long)puStack_110 + lStack_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2d8,0x9e,&local_e0);
    if (puStack_110 != auStack_100) {
      operator_delete(puStack_110);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    std::ios_base::~ios_base((ios_base *)&uStack_218);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&local_2fc);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_signature, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    size_t signature_len = max_signature_size;
    BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
    signature.resize(signature_len);
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size()));

    std::uniform_int_distribution<unsigned int> dist_diff{1, 255};
    std::uniform_int_distribution<unsigned int> dist_pos{1, PICNIC_MAX_SIGNATURE_SIZE};
    std::random_device rnd;
    std::default_random_engine eng{rnd()};

    for (size_t l = dist_pos(eng), rounds = rep; rounds; l += dist_pos(eng), --rounds) {
      std::vector<uint8_t> signature2{signature};
      signature2[l % signature2.size()] += dist_diff(eng);

      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size()));
    }
  }
}